

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::internal::UnitTestImpl::successful_test_case_count(UnitTestImpl *this)

{
  int iVar1;
  pointer ppTVar2;
  uint uVar3;
  int iVar4;
  pointer ppTVar5;
  
  ppTVar5 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar5 == ppTVar2) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      uVar3 = 0;
      if ((*ppTVar5)->should_run_ == true) {
        iVar1 = TestCase::failed_test_count(*ppTVar5);
        uVar3 = (uint)(iVar1 < 1);
        ppTVar2 = (this->test_cases_).
                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      iVar4 = iVar4 + uVar3;
      ppTVar5 = ppTVar5 + 1;
    } while (ppTVar5 != ppTVar2);
  }
  return iVar4;
}

Assistant:

std::string Message::GetString() const {
  return internal::StringStreamToString(ss_.get());
}